

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

string * __thiscall cmake::StripExtension(string *__return_storage_ptr__,cmake *this,string *file)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  
  lVar2 = std::__cxx11::string::rfind((char)file,0x2e);
  if (lVar2 == -1) {
LAB_001ac050:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)file);
  }
  else {
    std::__cxx11::string::substr((ulong)&ext,(ulong)file);
    bVar1 = IsSourceExtension(this,&ext);
    if (!bVar1) {
      bVar1 = IsHeaderExtension(this,&ext);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&ext);
        goto LAB_001ac050;
      }
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)file);
    std::__cxx11::string::~string((string *)&ext);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::StripExtension(const std::string& file) const
{
  auto dotpos = file.rfind('.');
  if (dotpos != std::string::npos) {
    auto ext = file.substr(dotpos + 1);
#if defined(_WIN32) || defined(__APPLE__)
    ext = cmSystemTools::LowerCase(ext);
#endif
    if (this->IsSourceExtension(ext) || this->IsHeaderExtension(ext)) {
      return file.substr(0, dotpos);
    }
  }
  return file;
}